

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O1

ON_BrepFace * __thiscall
ON_Brep::NewRuledFace
          (ON_Brep *this,ON_BrepEdge *edgeA,bool bRevEdgeA,ON_BrepEdge *edgeB,bool bRevEdgeB)

{
  ON_3dPoint point;
  ON_3dPoint point_00;
  int iVar1;
  int iVar2;
  ON_BrepEdge *pOVar3;
  ON_NurbsSurface *this_00;
  ON_BrepFace *pOVar4;
  bool bRev3d [4];
  ON_NurbsCurve cB;
  ON_NurbsCurve cA;
  undefined4 local_f0;
  int local_ec;
  ON_NurbsSurface *local_e8;
  int local_e0;
  int local_dc;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  ON_NurbsCurve local_b0;
  ON_NurbsCurve local_70;
  
  if (((edgeA->m_edge_index == edgeB->m_edge_index) ||
      (pOVar3 = Edge(this,edgeA->m_edge_index), pOVar3 != edgeA)) ||
     (pOVar3 = Edge(this,edgeB->m_edge_index), pOVar3 != edgeB)) {
    return (ON_BrepFace *)0x0;
  }
  ON_NurbsCurve::ON_NurbsCurve(&local_70);
  ON_NurbsCurve::ON_NurbsCurve(&local_b0);
  iVar2 = (*(edgeA->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
            _vptr_ON_Object[0x3f])(0,edgeA,&local_70,0);
  if (iVar2 != 0) {
    if (bRevEdgeA) {
      ON_NurbsCurve::Reverse(&local_70);
    }
    iVar2 = (*(edgeB->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
              _vptr_ON_Object[0x3f])(0,edgeB,&local_b0,0);
    if (iVar2 != 0) {
      if (bRevEdgeB) {
        ON_NurbsCurve::Reverse(&local_b0);
      }
      this_00 = ON_NurbsSurface::New();
      iVar2 = (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x40])
                        (this_00,&local_70,&local_b0,0,0);
      if (iVar2 != 0) {
        local_dc = edgeA->m_vi[bRevEdgeA];
        local_ec = edgeA->m_vi[!bRevEdgeA];
        iVar2 = edgeB->m_vi[!bRevEdgeB];
        local_e0 = edgeB->m_vi[bRevEdgeB];
        local_e8 = this_00;
        local_c8 = local_dc;
        iStack_c4 = local_ec;
        iStack_c0 = iVar2;
        iStack_bc = local_e0;
        if ((local_ec == iVar2) &&
           (point.y = ON_3dPoint::UnsetPoint.y, point.x = ON_3dPoint::UnsetPoint.x,
           point.z = ON_3dPoint::UnsetPoint.z, ON_NurbsSurface::CollapseSide(this_00,1,point),
           local_ec == iVar2)) {
          point_00.y = ON_3dPoint::UnsetPoint.y;
          point_00.x = ON_3dPoint::UnsetPoint.x;
          point_00.z = ON_3dPoint::UnsetPoint.z;
          ON_NurbsSurface::CollapseSide(local_e8,3,point_00);
        }
        iStack_d4 = -1;
        iStack_d0 = 0xffffffff;
        iStack_cc = -1;
        local_d8 = edgeA->m_edge_index;
        local_f0 = (uint)bRevEdgeA;
        pOVar3 = FindLinearEdge(this,local_ec,iVar2);
        iVar1 = local_dc;
        if (pOVar3 != (ON_BrepEdge *)0x0) {
          iStack_d4 = pOVar3->m_edge_index;
          local_f0._0_2_ = CONCAT11(pOVar3->m_vi[0] == iVar2,local_f0._0_1_);
        }
        iStack_d0 = edgeB->m_edge_index;
        local_f0._0_3_ = CONCAT12(!bRevEdgeB,(undefined2)local_f0);
        pOVar3 = FindLinearEdge(this,local_e0,local_dc);
        if (pOVar3 != (ON_BrepEdge *)0x0) {
          iStack_cc = pOVar3->m_edge_index;
          local_f0 = CONCAT13(pOVar3->m_vi[0] == iVar1,(undefined3)local_f0);
        }
        pOVar4 = NewFace(this,&local_e8->super_ON_Surface,&local_c8,&local_d8,(bool *)&local_f0);
        if (pOVar4 != (ON_BrepFace *)0x0) {
          SynchFaceOrientation(this,pOVar4->m_face_index);
        }
        goto LAB_00412c03;
      }
      (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])(this_00);
    }
  }
  pOVar4 = (ON_BrepFace *)0x0;
LAB_00412c03:
  ON_NurbsCurve::~ON_NurbsCurve(&local_b0);
  ON_NurbsCurve::~ON_NurbsCurve(&local_70);
  return pOVar4;
}

Assistant:

ON_BrepFace* ON_Brep::NewRuledFace(
      const ON_BrepEdge& edgeA,
      bool bRevEdgeA,
      const ON_BrepEdge& edgeB, 
      bool bRevEdgeB
      )
{
  if ( edgeA.m_edge_index == edgeB.m_edge_index )
    return nullptr;
  if ( Edge( edgeA.m_edge_index) != &edgeA )
    return nullptr;
  if ( Edge( edgeB.m_edge_index) != &edgeB )
    return nullptr;

  ON_NurbsCurve cA, cB;
  if ( !edgeA.GetNurbForm( cA ) )
    return nullptr;
  if ( bRevEdgeA )
    cA.Reverse();
  if ( !edgeB.GetNurbForm( cB ) )
    return nullptr;
  if ( bRevEdgeB )
    cB.Reverse();
  ON_NurbsSurface* srf = ON_NurbsSurface::New();
  if ( !srf->CreateRuledSurface( cA, cB ) )
  {
    delete srf;
    return nullptr;
  }

  // corner vertices (sw,se,ne,nw)
  int vid[4] = {-1,-1,-1,-1};
  vid[0] = edgeA.m_vi[bRevEdgeA?1:0];
  vid[1] = edgeA.m_vi[bRevEdgeA?0:1];
  vid[2] = edgeB.m_vi[bRevEdgeB?0:1];
  vid[3] = edgeB.m_vi[bRevEdgeB?1:0];

  if ( vid[1] == vid[2] )
  {
    // make sure surface has a singular east side
    srf->CollapseSide( 1 );
  }

  if ( vid[1] == vid[2] )
  {
    // make sure surface has a singular west side
    srf->CollapseSide( 3 );
  }

  // side edges (s,e,n,w)
  int eid[4] = {-1,-1,-1,-1};
  bool bRev3d[4] = {false,false,false,false};
  
  // south side
  eid[0] = edgeA.m_edge_index;
  bRev3d[0] = bRevEdgeA;
  
  // east side
  const ON_BrepEdge* east_edge = FindLinearEdge( *this, vid[1], vid[2] );
  if ( east_edge )
  {
    eid[1] = east_edge->m_edge_index;
    bRev3d[1] = (east_edge->m_vi[0] == vid[2]);
  }

  // north side
  eid[2] = edgeB.m_edge_index;
  bRev3d[2] = !bRevEdgeB;

  // west side
  const ON_BrepEdge* west_edge = FindLinearEdge( *this, vid[3], vid[0] );
  if ( west_edge )
  {
    eid[3] = west_edge->m_edge_index;
    bRev3d[3] = (west_edge->m_vi[0] == vid[0]);
  }

  ON_BrepFace* face = NewFace( srf, vid, eid, bRev3d );
  if ( face )
    SynchFaceOrientation( *this, face->m_face_index );
  return face;
}